

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O2

BuilderFor<DynamicCapability> *
capnp::DynamicValue::Builder::AsImpl<capnp::DynamicCapability,_(capnp::Kind)7>::apply
          (BuilderFor<DynamicCapability> *__return_storage_ptr__,Builder *builder)

{
  Fault f;
  Fault local_18;
  
  if (builder->type == CAPABILITY) {
    (*(code *)(((builder->field_1).structValue.builder.segment)->super_SegmentReader).arena[4].
              _vptr_Arena)(__return_storage_ptr__);
    (__return_storage_ptr__->schema).super_Schema.raw =
         (RawBrandedSchema *)(builder->field_1).textValue.content.size_;
  }
  else {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[21]>
              (&local_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x724,FAILED,"builder.type == CAPABILITY","\"Value type mismatch.\"",
               (char (*) [21])"Value type mismatch.");
    (__return_storage_ptr__->super_Client).hook.disposer = (Disposer *)0x0;
    (__return_storage_ptr__->super_Client).hook.ptr = (ClientHook *)0x0;
    (__return_storage_ptr__->schema).super_Schema.raw = (RawBrandedSchema *)0x2a5470;
    kj::_::Debug::Fault::~Fault(&local_18);
  }
  return __return_storage_ptr__;
}

Assistant:

BuilderFor<DynamicCapability> DynamicValue::Builder::AsImpl<DynamicCapability>::apply(
    Builder& builder) {
  KJ_REQUIRE(builder.type == CAPABILITY, "Value type mismatch.") {
    return DynamicCapability::Client();
  }
  return builder.capabilityValue;
}